

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_validator_factory_base.hpp
# Opt level: O0

unique_ptr<jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
 __thiscall
jsoncons::jsonschema::
schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
::get_or_create_reference
          (schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *this,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *schema,
          uri_wrapper *identifier)

{
  bool bVar1;
  pointer ppVar2;
  vector<std::pair<jsoncons::uri,_jsoncons::jsonschema::ref<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>,_std::allocator<std::pair<jsoncons::uri,_jsoncons::jsonschema::ref<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>_>
  *this_00;
  uri_wrapper *in_RCX;
  uri *in_RDX;
  long in_RSI;
  ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *in_RDI
  ;
  schema_validator_ptr_type s;
  anchor_uri_map_type anchor_dict2;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *subsch;
  iterator it2;
  iterator it;
  __single_object *orig;
  map<jsoncons::uri,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::less<jsoncons::uri>,_std::allocator<std::pair<const_jsoncons::uri,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffc98;
  schema_validator_ptr_type *schema_00;
  compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffffca0;
  iterator in_stack_fffffffffffffca8;
  unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffcb0;
  uri *in_stack_fffffffffffffd00;
  _Head_base<0UL,_jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
  __args_1;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *__args;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
  local_2a8 [2];
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffde0;
  uri_wrapper *in_stack_fffffffffffffde8;
  compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffffdf0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffffec0;
  schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffffec8;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
  in_stack_fffffffffffffed0;
  anchor_uri_map_type *in_stack_fffffffffffffef0;
  schema_validator_ptr_type local_80 [7];
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_48;
  _Self local_40;
  _Self local_38;
  _Self local_30;
  _Self local_28;
  uri_wrapper *local_20;
  uri *local_18;
  
  __args = *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)(in_RSI + 0xa0);
  __args_1._M_head_impl = in_RDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  uri_wrapper::uri(in_RCX);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::less<jsoncons::uri>,_std::allocator<std::pair<const_jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>_>
       ::find((map<jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::less<jsoncons::uri>,_std::allocator<std::pair<const_jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>_>
               *)in_stack_fffffffffffffc98,(key_type *)0x849790);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::less<jsoncons::uri>,_std::allocator<std::pair<const_jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>_>
       ::end((map<jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::less<jsoncons::uri>,_std::allocator<std::pair<const_jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>_>
              *)in_stack_fffffffffffffc98);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    uri_wrapper::uri(local_20);
    std::
    _Rb_tree_iterator<std::pair<const_jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
                 *)0x8497fe);
    std::
    make_unique<jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::uri_const&,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*&>
              (__args,(uri *)__args_1._M_head_impl,
               (schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                **)in_RDI);
  }
  else {
    bVar1 = uri_wrapper::has_fragment(&in_stack_fffffffffffffca0->base_uri_);
    if ((bVar1) && (bVar1 = uri_wrapper::has_plain_name_fragment(local_20), !bVar1)) {
      uri_wrapper::uri(local_20);
      local_38._M_node =
           (_Base_ptr)
           std::
           map<jsoncons::uri,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::less<jsoncons::uri>,_std::allocator<std::pair<const_jsoncons::uri,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
           ::find(in_stack_fffffffffffffc98,(key_type *)0x849879);
      local_40._M_node =
           (_Base_ptr)
           std::
           map<jsoncons::uri,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::less<jsoncons::uri>,_std::allocator<std::pair<const_jsoncons::uri,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
           ::end(in_stack_fffffffffffffc98);
      bVar1 = std::operator!=(&local_38,&local_40);
      if (bVar1) {
        ppVar2 = std::
                 _Rb_tree_iterator<std::pair<const_jsoncons::uri,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_jsoncons::uri,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
                               *)0x8498c8);
        local_48 = &ppVar2->second;
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper>_>_>
        ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper>_>_>
                         *)0x8498e3);
        local_268 = 0;
        uStack_260 = 0;
        local_278 = 0;
        uStack_270 = 0;
        local_288 = 0;
        uStack_280 = 0;
        local_258 = 0;
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)0x849929);
        compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        ::compilation_context
                  (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
        detail::
        span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
        ::span(local_2a8);
        schema_00 = local_80;
        make_cross_draft_schema_validator
                  (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                   in_stack_fffffffffffffed0,in_stack_fffffffffffffef0);
        compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        ::~compilation_context(in_stack_fffffffffffffca0);
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)0x8499b8);
        std::
        map<jsoncons::uri,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::less<jsoncons::uri>,std::allocator<std::pair<jsoncons::uri_const,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
        ::erase_abi_cxx11_((map<jsoncons::uri,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::less<jsoncons::uri>,_std::allocator<std::pair<const_jsoncons::uri,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffca0,in_stack_fffffffffffffca8);
        uri_wrapper::uri(local_20);
        std::
        unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        ::get((unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               *)in_stack_fffffffffffffca0);
        std::
        make_unique<jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::uri_const&,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>
                  (__args,(uri *)__args_1._M_head_impl,
                   (schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    **)in_RDI);
        save_schema((schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffca0,schema_00);
        std::
        unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        ::~unique_ptr(in_stack_fffffffffffffcb0);
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper>_>_>
        ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper>_>_>
                          *)0x849b21);
        return (__uniq_ptr_data<jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_true,_true>
                )(tuple<jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                  )__args_1._M_head_impl;
      }
    }
    uri_wrapper::uri(local_20);
    std::
    make_unique<jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::uri_const&>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)in_RDI,
               in_stack_fffffffffffffd00);
    this_00 = (vector<std::pair<jsoncons::uri,_jsoncons::jsonschema::ref<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>,_std::allocator<std::pair<jsoncons::uri,_jsoncons::jsonschema::ref<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>_>
               *)(in_RSI + 0x118);
    uri_wrapper::uri(local_20);
    std::
    unique_ptr<jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::get((unique_ptr<jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
           *)in_stack_fffffffffffffca0);
    std::
    vector<std::pair<jsoncons::uri,jsoncons::jsonschema::ref<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>,std::allocator<std::pair<jsoncons::uri,jsoncons::jsonschema::ref<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>>>
    ::
    emplace_back<jsoncons::uri_const&,jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>
              (this_00,local_18,
               (ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                **)in_stack_fffffffffffffca0);
  }
  return (__uniq_ptr_data<jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_true,_true>
          )(tuple<jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            )__args_1._M_head_impl;
}

Assistant:

std::unique_ptr<ref_validator<Json>> get_or_create_reference(const Json& schema, const uri_wrapper& identifier)
        {
            // a schema already exists
            auto it = this->schema_store_ptr_->find(identifier.uri());
            if (it != this->schema_store_ptr_->end())
            {
                return jsoncons::make_unique<ref_validator_type>(schema, identifier.uri(), (*it).second);
            }

            // referencing an unknown keyword, turn it into schema
            //
            // an unknown keyword can only be referenced by a JSONPointer,
            // not by a plain name identifier
            if (identifier.has_fragment() && !identifier.has_plain_name_fragment()) 
            {
                //std::string fragment = std::string(identifier.fragment());

                auto it2 = this->unknown_keywords_.find(identifier.uri());
                if (it2 != this->unknown_keywords_.end())
                {
                    auto& subsch = it2->second;
                    anchor_uri_map_type anchor_dict2;
                    auto s = make_cross_draft_schema_validator(compilation_context<Json>(identifier), subsch, {}, anchor_dict2);
                    this->unknown_keywords_.erase(it2);
                    auto orig = jsoncons::make_unique<ref_validator_type>(schema, identifier.uri(), s.get());
                    this->save_schema(std::move(s));
                    return orig;
                }
            }

            // get or create a ref_validator
            auto orig = jsoncons::make_unique<ref_validator_type>(schema, identifier.uri());

            this->unresolved_refs_.emplace_back(identifier.uri(), orig.get());
            return orig;
        }